

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O2

void print_time(FILE *fp)

{
  tm *__tp;
  time_t raw_time;
  char time_string [9];
  
  time(&raw_time);
  __tp = localtime(&raw_time);
  time_string[8] = '\0';
  time_string[0] = '\0';
  time_string[1] = '\0';
  time_string[2] = '\0';
  time_string[3] = '\0';
  time_string[4] = '\0';
  time_string[5] = '\0';
  time_string[6] = '\0';
  time_string[7] = '\0';
  strftime(time_string,9,"%H:%M:%S",__tp);
  fprintf((FILE *)fp,"%s  ",time_string);
  return;
}

Assistant:

void print_time(FILE* fp) {
    time_t raw_time;
    time (&raw_time);
    struct tm * time_info = localtime(&raw_time);

    char time_string[9] = {0};
    strftime(time_string, 9, "%H:%M:%S", time_info);

    fprintf(fp, "%s  ", time_string);
}